

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# job_manager.cpp
# Opt level: O0

Error * __thiscall
ot::commissioner::JobManager::AppendImport
          (Error *__return_storage_ptr__,JobManager *this,uint64_t aXpanId,Expression *aExpr)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  Error *pEVar4;
  size_type sVar5;
  reference other;
  reference pvVar6;
  size_type sVar7;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  aVar8;
  basic_string_view<char> bVar9;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  bool local_c8a;
  bool local_c5a;
  ErrorCode local_b9c;
  undefined1 local_b98 [3];
  bool condition;
  string_t local_b70;
  Error local_b50;
  Error local_b28;
  anon_class_1_0_00000001 local_afa;
  v10 local_af9;
  v10 *local_af8;
  size_t local_af0;
  string local_ae8;
  Error local_ac8;
  byte local_a99;
  string local_a98;
  undefined1 local_a78 [8];
  CommissionerDataset dataset_3;
  ErrorCode local_9fc;
  Error local_9f8;
  string_t local_9d0;
  Error local_9b0;
  Error local_988;
  anon_class_1_0_00000001 local_95a;
  v10 local_959;
  v10 *local_958;
  size_t local_950;
  string local_948;
  Error local_928;
  byte local_8f9;
  string local_8f8;
  undefined1 local_8d8 [8];
  BbrDataset dataset_2;
  anon_class_1_0_00000001 local_84a;
  v10 local_849;
  v10 *local_848;
  size_t local_840;
  string local_838;
  Error local_818;
  ErrorCode local_7ec;
  Error local_7e8;
  string_t local_7c0;
  Error local_7a0;
  Error local_778;
  undefined1 local_750 [8];
  PendingOperationalDataset dataset_1;
  ErrorCode local_64c;
  Error local_648;
  string_t local_620;
  Error local_600;
  Error local_5d8;
  undefined1 local_5b0 [8];
  ActiveOperationalDataset dataset;
  anon_class_1_0_00000001 local_4b2;
  v10 local_4b1;
  v10 *local_4b0;
  size_t local_4a8;
  string local_4a0;
  Error local_480;
  string local_458;
  string local_438;
  string_t local_418;
  string local_3f8;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_3d8;
  string local_3c8;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_3a8;
  function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
  local_398;
  input_adapter local_378;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_368;
  ErrorCode local_358 [4];
  Error local_348;
  undefined1 local_320 [8];
  Json json;
  Json jsonSrc;
  string jsonStr;
  Expression *aExpr_local;
  uint64_t aXpanId_local;
  JobManager *this_local;
  Error *error;
  undefined1 local_2a0 [16];
  v10 *local_290;
  ulong local_288;
  v10 *local_280;
  size_t sStack_278;
  string *local_270;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_268 [3];
  undefined1 local_250 [16];
  v10 *local_240;
  ulong local_238;
  v10 *local_230;
  size_t sStack_228;
  string *local_220;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_218 [3];
  undefined1 local_200 [16];
  v10 *local_1f0;
  ulong local_1e8;
  v10 *local_1e0;
  size_t sStack_1d8;
  string *local_1d0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_1c8 [2];
  undefined1 local_1b8 [16];
  v10 *local_1a8;
  ulong local_1a0;
  v10 *local_198;
  size_t sStack_190;
  string *local_188;
  v10 *local_180;
  v10 **local_178;
  v10 *local_170;
  v10 **local_168;
  v10 *local_160;
  v10 **local_158;
  v10 *local_150;
  v10 **local_148;
  v10 **local_140;
  v10 *local_138;
  size_t sStack_130;
  v10 **local_120;
  v10 *local_118;
  size_t sStack_110;
  v10 **local_100;
  v10 *local_f8;
  size_t sStack_f0;
  v10 **local_e0;
  v10 *local_d8;
  size_t sStack_d0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_c8;
  undefined1 *local_c0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_b8;
  undefined1 *local_b0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_a8;
  undefined1 *local_a0;
  Error **local_98;
  undefined1 *local_90;
  Error **local_88;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_80;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_78;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_70;
  Error **local_68;
  undefined8 local_60;
  undefined1 *local_58;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_50;
  undefined8 local_48;
  undefined1 *local_40;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_38;
  undefined8 local_30;
  undefined1 *local_28;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_20;
  undefined8 local_18;
  undefined1 *local_10;
  
  bVar1 = false;
  Error::Error(__return_storage_ptr__);
  std::__cxx11::string::string((string *)&jsonSrc.m_value.boolean);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)&json.m_value,(nullptr_t)0x0);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)local_320,(nullptr_t)0x0);
  JsonFromFile(&local_348,(string *)&jsonSrc.m_value,&this->mImportFile);
  pEVar4 = Error::operator=(__return_storage_ptr__,&local_348);
  local_358[0] = kNone;
  bVar2 = commissioner::operator!=(pEVar4,local_358);
  Error::~Error(&local_348);
  if (!bVar2) {
    nlohmann::detail::input_adapter::
    input_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (&local_378,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&jsonSrc.m_value
              );
    std::
    function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
    ::function(&local_398,(nullptr_t)0x0);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::parse(&local_368,&local_378,&local_398,true);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 *)&json.m_value,&local_368);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json(&local_368);
    std::
    function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
    ::~function(&local_398);
    nlohmann::detail::input_adapter::~input_adapter(&local_378);
    if (aXpanId == 0) {
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::basic_json(&local_3a8,
                   (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    *)&json.m_value);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)local_320,&local_3a8);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::~basic_json(&local_3a8);
    }
    else {
      utils::Hex<unsigned_long>(&local_3c8,aXpanId);
      sVar5 = nlohmann::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
              ::count<std::__cxx11::string>
                        ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                          *)&json.m_value.boolean,&local_3c8);
      std::__cxx11::string::~string((string *)&local_3c8);
      if (sVar5 != 0) {
        utils::Hex<unsigned_long>(&local_3f8,aXpanId);
        other = nlohmann::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                              *)&json.m_value,&local_3f8);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::basic_json(&local_3d8,other);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                     *)local_320,&local_3d8);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::~basic_json(&local_3d8);
        std::__cxx11::string::~string((string *)&local_3f8);
      }
    }
    aVar8.values_ = (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)0x0;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::dump(&local_418,
           (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            *)local_320,4,' ',false,strict);
    std::__cxx11::string::operator=((string *)&jsonSrc.m_value.boolean,(string *)&local_418);
    std::__cxx11::string::~string((string *)&local_418);
    pvVar6 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](aExpr,0);
    utils::ToLower(&local_438,pvVar6);
    bVar2 = std::operator==(&local_438,"opdataset");
    std::__cxx11::string::~string((string *)&local_438);
    if (bVar2) {
      pvVar6 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](aExpr,1);
      utils::ToLower(&local_458,pvVar6);
      bVar3 = std::operator==(&local_458,"set");
      bVar2 = false;
      if (bVar3) {
        sVar7 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(aExpr);
        bVar2 = sVar7 == 3;
      }
      std::__cxx11::string::~string((string *)&local_458);
      if (!bVar2) {
        AppendImport::anon_class_1_0_00000001::operator()(&local_4b2);
        local_178 = &local_4b0;
        local_180 = &local_4b1;
        bVar9 = ::fmt::v10::operator()(local_180);
        local_4a8 = bVar9.size_;
        local_4b0 = (v10 *)bVar9.data_;
        ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
        local_188 = &local_4a0;
        local_198 = local_4b0;
        sStack_190 = local_4a8;
        local_140 = &local_198;
        local_1a8 = local_4b0;
        local_1a0 = local_4a8;
        local_138 = local_1a8;
        sStack_130 = local_1a0;
        local_1c8[0] = ::fmt::v10::
                       make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
        local_c0 = local_1b8;
        local_c8 = local_1c8;
        local_18 = 0;
        fmt.size_ = 0;
        fmt.data_ = (char *)local_1a0;
        args.field_1.values_ = aVar8.values_;
        args.desc_ = (unsigned_long_long)local_c8;
        local_70 = local_c8;
        local_20 = local_c8;
        local_10 = local_c0;
        ::fmt::v10::vformat_abi_cxx11_(&local_4a0,local_1a8,fmt,args);
        Error::Error(&local_480,kInvalidArgs,&local_4a0);
        Error::operator=(__return_storage_ptr__,&local_480);
        Error::~Error(&local_480);
        std::__cxx11::string::~string((string *)&local_4a0);
        goto LAB_002ecb7f;
      }
      pvVar6 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](aExpr,2);
      utils::ToLower((string *)&dataset.mPresentFlags,pvVar6);
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &dataset.mPresentFlags,"active");
      std::__cxx11::string::~string((string *)&dataset.mPresentFlags);
      if (!bVar2) {
        pvVar6 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](aExpr,2);
        utils::ToLower((string *)&dataset_1.mPendingTimestamp,pvVar6);
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&dataset_1.mPendingTimestamp,"pending");
        std::__cxx11::string::~string((string *)&dataset_1.mPendingTimestamp);
        if (!bVar2) {
          AppendImport::anon_class_1_0_00000001::operator()(&local_84a);
          local_168 = &local_848;
          local_170 = &local_849;
          bVar9 = ::fmt::v10::operator()(local_170);
          local_840 = bVar9.size_;
          local_848 = (v10 *)bVar9.data_;
          ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
          local_1d0 = &local_838;
          local_1e0 = local_848;
          sStack_1d8 = local_840;
          local_120 = &local_1e0;
          local_1f0 = local_848;
          local_1e8 = local_840;
          local_118 = local_1f0;
          sStack_110 = local_1e8;
          local_218[0] = ::fmt::v10::
                         make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>()
          ;
          local_b0 = local_200;
          local_b8 = local_218;
          local_30 = 0;
          fmt_00.size_ = 0;
          fmt_00.data_ = (char *)local_1e8;
          args_00.field_1.values_ = aVar8.values_;
          args_00.desc_ = (unsigned_long_long)local_b8;
          local_78 = local_b8;
          local_38 = local_b8;
          local_28 = local_b0;
          ::fmt::v10::vformat_abi_cxx11_(&local_838,local_1f0,fmt_00,args_00);
          Error::Error(&local_818,kInvalidArgs,&local_838);
          Error::operator=(__return_storage_ptr__,&local_818);
          Error::~Error(&local_818);
          std::__cxx11::string::~string((string *)&local_838);
          goto LAB_002ecb7f;
        }
        PendingOperationalDataset::PendingOperationalDataset((PendingOperationalDataset *)local_750)
        ;
        PendingDatasetFromJson
                  (&local_778,(PendingOperationalDataset *)local_750,(string *)&jsonSrc.m_value);
        Error::operator=(__return_storage_ptr__,&local_778);
        Error::~Error(&local_778);
        Error::Error(&local_7a0);
        bVar2 = Error::operator!=(__return_storage_ptr__,&local_7a0);
        Error::~Error(&local_7a0);
        if (bVar2) {
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::dump(&local_7c0,
                 (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  *)&json.m_value,4,' ',false,strict);
          std::__cxx11::string::operator=((string *)&jsonSrc.m_value.boolean,(string *)&local_7c0);
          std::__cxx11::string::~string((string *)&local_7c0);
          PendingDatasetFromJson
                    (&local_7e8,(PendingOperationalDataset *)local_750,(string *)&jsonSrc.m_value);
          pEVar4 = Error::operator=(__return_storage_ptr__,&local_7e8);
          local_7ec = kNone;
          bVar2 = commissioner::operator!=(pEVar4,&local_7ec);
          Error::~Error(&local_7e8);
          if (!bVar2) goto LAB_002ebe74;
          bVar2 = true;
        }
        else {
LAB_002ebe74:
          bVar2 = false;
        }
        PendingOperationalDataset::~PendingOperationalDataset
                  ((PendingOperationalDataset *)local_750);
        if (bVar2) goto joined_r0x002ebc29;
        goto LAB_002ecb68;
      }
      ActiveOperationalDataset::ActiveOperationalDataset((ActiveOperationalDataset *)local_5b0);
      ActiveDatasetFromJson
                (&local_5d8,(ActiveOperationalDataset *)local_5b0,(string *)&jsonSrc.m_value);
      Error::operator=(__return_storage_ptr__,&local_5d8);
      Error::~Error(&local_5d8);
      Error::Error(&local_600);
      bVar2 = Error::operator!=(__return_storage_ptr__,&local_600);
      Error::~Error(&local_600);
      if (bVar2) {
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::dump(&local_620,
               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)&json.m_value,4,' ',false,strict);
        std::__cxx11::string::operator=((string *)&jsonSrc.m_value.boolean,(string *)&local_620);
        std::__cxx11::string::~string((string *)&local_620);
        ActiveDatasetFromJson
                  (&local_648,(ActiveOperationalDataset *)local_5b0,(string *)&jsonSrc.m_value);
        pEVar4 = Error::operator=(__return_storage_ptr__,&local_648);
        local_64c = kNone;
        bVar2 = commissioner::operator!=(pEVar4,&local_64c);
        Error::~Error(&local_648);
        if (!bVar2) goto LAB_002ebbf8;
        bVar2 = true;
      }
      else {
LAB_002ebbf8:
        bVar2 = false;
      }
      ActiveOperationalDataset::~ActiveOperationalDataset((ActiveOperationalDataset *)local_5b0);
      if (bVar2) {
joined_r0x002ebc29:
        if (!bVar2) goto LAB_002ecb90;
        goto LAB_002ecb7f;
      }
    }
    else {
      pvVar6 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](aExpr,0);
      utils::ToLower((string *)&dataset_2.mPresentFlags,pvVar6);
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &dataset_2.mPresentFlags,"bbrdataset");
      std::__cxx11::string::~string((string *)&dataset_2.mPresentFlags);
      if (bVar2) {
        BbrDataset::BbrDataset((BbrDataset *)local_8d8);
        sVar7 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(aExpr);
        local_8f9 = 0;
        local_c5a = false;
        if (sVar7 == 2) {
          pvVar6 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](aExpr,1);
          utils::ToLower(&local_8f8,pvVar6);
          local_8f9 = 1;
          local_c5a = std::operator==(&local_8f8,"set");
        }
        if ((local_8f9 & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_8f8);
        }
        if (((local_c5a ^ 0xffU) & 1) == 0) {
          BbrDatasetFromJson(&local_988,(BbrDataset *)local_8d8,(string *)&jsonSrc.m_value);
          Error::operator=(__return_storage_ptr__,&local_988);
          Error::~Error(&local_988);
          Error::Error(&local_9b0);
          bVar2 = Error::operator!=(__return_storage_ptr__,&local_9b0);
          Error::~Error(&local_9b0);
          if (bVar2) {
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::dump(&local_9d0,
                   (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    *)&json.m_value,4,' ',false,strict);
            std::__cxx11::string::operator=((string *)&jsonSrc.m_value.boolean,(string *)&local_9d0)
            ;
            std::__cxx11::string::~string((string *)&local_9d0);
            BbrDatasetFromJson(&local_9f8,(BbrDataset *)local_8d8,(string *)&jsonSrc.m_value);
            pEVar4 = Error::operator=(__return_storage_ptr__,&local_9f8);
            local_9fc = kNone;
            bVar2 = commissioner::operator!=(pEVar4,&local_9fc);
            Error::~Error(&local_9f8);
            if (bVar2) {
              bVar2 = true;
              goto LAB_002ec5a4;
            }
          }
          bVar2 = false;
        }
        else {
          AppendImport::anon_class_1_0_00000001::operator()(&local_95a);
          local_158 = &local_958;
          local_160 = &local_959;
          bVar9 = ::fmt::v10::operator()(local_160);
          local_950 = bVar9.size_;
          local_958 = (v10 *)bVar9.data_;
          ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
          local_220 = &local_948;
          local_230 = local_958;
          sStack_228 = local_950;
          local_100 = &local_230;
          local_240 = local_958;
          local_238 = local_950;
          local_f8 = local_240;
          sStack_f0 = local_238;
          local_268[0] = ::fmt::v10::
                         make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>()
          ;
          local_a0 = local_250;
          local_a8 = local_268;
          local_48 = 0;
          fmt_01.size_ = 0;
          fmt_01.data_ = (char *)local_238;
          args_01.field_1.values_ = aVar8.values_;
          args_01.desc_ = (unsigned_long_long)local_a8;
          local_80 = local_a8;
          local_50 = local_a8;
          local_40 = local_a0;
          ::fmt::v10::vformat_abi_cxx11_(&local_948,local_240,fmt_01,args_01);
          Error::Error(&local_928,kInvalidArgs,&local_948);
          Error::operator=(__return_storage_ptr__,&local_928);
          Error::~Error(&local_928);
          std::__cxx11::string::~string((string *)&local_948);
          bVar2 = true;
        }
LAB_002ec5a4:
        BbrDataset::~BbrDataset((BbrDataset *)local_8d8);
        if (bVar2) goto joined_r0x002ebc29;
      }
      else {
        pvVar6 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](aExpr,0);
        utils::ToLower((string *)&dataset_3.mJoinerUdpPort,pvVar6);
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&dataset_3.mJoinerUdpPort,"commdataset");
        std::__cxx11::string::~string((string *)&dataset_3.mJoinerUdpPort);
        if (!bVar2) {
          __assert_fail("condition",
                        "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager.cpp"
                        ,0x26c,
                        "Error ot::commissioner::JobManager::AppendImport(uint64_t, Interpreter::Expression &)"
                       );
        }
        CommissionerDataset::CommissionerDataset((CommissionerDataset *)local_a78);
        sVar7 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(aExpr);
        local_a99 = 0;
        local_c8a = false;
        if (sVar7 == 2) {
          pvVar6 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](aExpr,1);
          utils::ToLower(&local_a98,pvVar6);
          local_a99 = 1;
          local_c8a = std::operator==(&local_a98,"set");
        }
        if ((local_a99 & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_a98);
        }
        if (((local_c8a ^ 0xffU) & 1) == 0) {
          CommissionerDatasetFromJson
                    (&local_b28,(CommissionerDataset *)local_a78,(string *)&jsonSrc.m_value);
          Error::operator=(__return_storage_ptr__,&local_b28);
          Error::~Error(&local_b28);
          Error::Error(&local_b50);
          bVar2 = Error::operator!=(__return_storage_ptr__,&local_b50);
          Error::~Error(&local_b50);
          if (bVar2) {
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::dump(&local_b70,
                   (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    *)&json.m_value,4,' ',false,strict);
            std::__cxx11::string::operator=((string *)&jsonSrc.m_value.boolean,(string *)&local_b70)
            ;
            std::__cxx11::string::~string((string *)&local_b70);
            CommissionerDatasetFromJson
                      ((Error *)local_b98,(CommissionerDataset *)local_a78,
                       (string *)&jsonSrc.m_value);
            pEVar4 = Error::operator=(__return_storage_ptr__,(Error *)local_b98);
            local_b9c = kNone;
            bVar2 = commissioner::operator!=(pEVar4,&local_b9c);
            Error::~Error((Error *)local_b98);
            if (bVar2) {
              bVar2 = true;
              goto LAB_002ecadf;
            }
          }
          bVar2 = false;
        }
        else {
          AppendImport::anon_class_1_0_00000001::operator()(&local_afa);
          local_148 = &local_af8;
          local_150 = &local_af9;
          bVar9 = ::fmt::v10::operator()(local_150);
          local_af0 = bVar9.size_;
          local_af8 = (v10 *)bVar9.data_;
          ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
          local_270 = &local_ae8;
          local_280 = local_af8;
          sStack_278 = local_af0;
          local_e0 = &local_280;
          local_290 = local_af8;
          local_288 = local_af0;
          local_d8 = local_290;
          sStack_d0 = local_288;
          error = (Error *)::fmt::v10::
                           make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>
                                     ();
          local_90 = local_2a0;
          local_98 = &error;
          local_60 = 0;
          fmt_02.size_ = 0;
          fmt_02.data_ = (char *)local_288;
          args_02.field_1.values_ = aVar8.values_;
          args_02.desc_ = (unsigned_long_long)local_98;
          local_88 = local_98;
          local_68 = local_98;
          local_58 = local_90;
          ::fmt::v10::vformat_abi_cxx11_(&local_ae8,local_290,fmt_02,args_02);
          Error::Error(&local_ac8,kInvalidArgs,&local_ae8);
          Error::operator=(__return_storage_ptr__,&local_ac8);
          Error::~Error(&local_ac8);
          std::__cxx11::string::~string((string *)&local_ae8);
          bVar2 = true;
        }
LAB_002ecadf:
        CommissionerDataset::~CommissionerDataset((CommissionerDataset *)local_a78);
        if (bVar2) goto joined_r0x002ebc29;
      }
    }
LAB_002ecb68:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(aExpr,(value_type *)&jsonSrc.m_value);
  }
LAB_002ecb7f:
  bVar1 = true;
LAB_002ecb90:
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 *)local_320);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 *)&json.m_value);
  std::__cxx11::string::~string((string *)&jsonSrc.m_value.boolean);
  if (!bVar1) {
    Error::~Error(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Error JobManager::AppendImport(uint64_t aXpanId, Interpreter::Expression &aExpr)
{
    Error       error;
    std::string jsonStr;
    Json        jsonSrc;
    Json        json;

    SuccessOrExit(error = JsonFromFile(jsonStr, mImportFile));
    jsonSrc = Json::parse(jsonStr);
    if (aXpanId == 0) // must be single command
    {
        json = jsonSrc;
    }
    else if (jsonSrc.count(utils::Hex(aXpanId)) > 0)
    {
        json = jsonSrc[utils::Hex(aXpanId)];
    }
    jsonStr = json.dump(JSON_INDENT_DEFAULT);
    if (utils::ToLower(aExpr[0]) == "opdataset")
    {
        VerifyOrExit(utils::ToLower(aExpr[1]) == "set" && aExpr.size() == 3,
                     error = ERROR_INVALID_ARGS(SYNTAX_IMPORT_UNSUPPORTED));
        if (utils::ToLower(aExpr[2]) == "active")
        {
            ActiveOperationalDataset dataset;
            error = ActiveDatasetFromJson(dataset, jsonStr);
            if (error != ERROR_NONE)
            {
                jsonStr = jsonSrc.dump(JSON_INDENT_DEFAULT);
                SuccessOrExit(error = ActiveDatasetFromJson(dataset, jsonStr));
            }
            // TODO: try importing wrong format
        }
        else if (utils::ToLower(aExpr[2]) == "pending")
        {
            PendingOperationalDataset dataset;
            error = PendingDatasetFromJson(dataset, jsonStr);
            if (error != ERROR_NONE)
            {
                jsonStr = jsonSrc.dump(JSON_INDENT_DEFAULT);
                SuccessOrExit(error = PendingDatasetFromJson(dataset, jsonStr));
            }
            // TODO: try importing wrong format
        }
        else
        {
            ExitNow(error = ERROR_INVALID_ARGS(SYNTAX_IMPORT_UNSUPPORTED));
        }
    }
    else if (utils::ToLower(aExpr[0]) == "bbrdataset")
    {
        BbrDataset dataset;
        VerifyOrExit(aExpr.size() == 2 && utils::ToLower(aExpr[1]) == "set",
                     error = ERROR_INVALID_ARGS(SYNTAX_IMPORT_UNSUPPORTED));
        error = BbrDatasetFromJson(dataset, jsonStr);
        if (error != ERROR_NONE)
        {
            jsonStr = jsonSrc.dump(JSON_INDENT_DEFAULT);
            SuccessOrExit(error = BbrDatasetFromJson(dataset, jsonStr));
        }
        // TODO: try importing wrong format
    }
    else if (utils::ToLower(aExpr[0]) == "commdataset")
    {
        CommissionerDataset dataset;
        VerifyOrExit(aExpr.size() == 2 && utils::ToLower(aExpr[1]) == "set",
                     error = ERROR_INVALID_ARGS(SYNTAX_IMPORT_UNSUPPORTED));
        error = CommissionerDatasetFromJson(dataset, jsonStr);
        if (error != ERROR_NONE)
        {
            jsonStr = jsonSrc.dump(JSON_INDENT_DEFAULT);
            SuccessOrExit(error = CommissionerDatasetFromJson(dataset, jsonStr));
        }
        // TODO: try importing wrong format
    }
    else
    {
        ASSERT(false); // never to reach here
    }
    aExpr.push_back(jsonStr);
exit:
    return error;
}